

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniGUI.c
# Opt level: O1

void DrawMatrix(uint16_t Xpos,uint16_t Ypos,uint16_t Width,uint16_t High,uint8_t *Matrix)

{
  byte bVar1;
  undefined6 in_register_0000000a;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint8_t *puVar6;
  uint uVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte in_R11B;
  uint unaff_R14D;
  ulong uVar10;
  uint8_t *local_68;
  uint local_38;
  
  uVar3 = (uint)Width;
  if ((int)CONCAT62(in_register_0000000a,High) != 0) {
    uVar2 = (ulong)Width;
    pbVar9 = Matrix + 2;
    local_68 = Matrix + 1;
    uVar7 = 2;
    uVar4 = 0;
    puVar6 = Matrix;
    do {
      if (Width != 0) {
        uVar10 = 0;
        pbVar8 = pbVar9;
        uVar5 = uVar7;
        do {
          if (bmp_BitCount < 0x10) {
            if (((bmp_BitCount == '\x01') || (bmp_BitCount == '\x04')) || (bmp_BitCount == '\b')) {
              bVar1 = puVar6[uVar10];
              uVar3 = (uint)palette[bVar1].red;
              unaff_R14D = (uint)palette[bVar1].blue;
              in_R11B = palette[bVar1].green;
            }
          }
          else if (bmp_BitCount == '\x10') {
            uVar3 = (uint)(local_68[uVar10 * 2 + -1] * '\x02' & 0xf8);
            in_R11B = local_68[uVar10 * 2] >> 2 & 0x38 | local_68[uVar10 * 2 + -1] << 6;
            unaff_R14D = (uint)(byte)(local_68[uVar10 * 2] << 3);
          }
          else if (bmp_BitCount == '\x18') {
            uVar3 = (uint)pbVar8[-2];
            in_R11B = pbVar8[-1];
            unaff_R14D = (uint)*pbVar8;
          }
          else if (bmp_BitCount == ' ') {
            uVar3 = (uint)Matrix[uVar5 - 2];
            in_R11B = Matrix[uVar5 - 1];
            unaff_R14D = (uint)Matrix[uVar5];
          }
          if (((ushort)(Xpos + uVar10) < gstI80DevInfo.usPanelW) && (Ypos < gstI80DevInfo.usPanelH))
          {
            local_38 = (uint)Ypos;
            gpFrameBuf[((uint)(Xpos + uVar10) & 0xffff) + gstI80DevInfo.usPanelW * local_38] =
                 (uint8_t)((ulong)((uint)in_R11B * 0x24b + (uVar3 & 0xff) * 299 +
                                   (unaff_R14D & 0xff) * 0x72 + 500) * 0x418938 >> 0x20);
          }
          uVar10 = uVar10 + 1;
          uVar5 = uVar5 + 4;
          pbVar8 = pbVar8 + 3;
        } while (uVar2 != uVar10);
      }
      Ypos = Ypos + 1;
      uVar4 = uVar4 + 1;
      puVar6 = puVar6 + uVar2;
      uVar7 = uVar7 + (uint)Width * 4;
      pbVar9 = pbVar9 + uVar2 * 3;
      local_68 = local_68 + (uint)Width * 2;
    } while (uVar4 != High);
  }
  return;
}

Assistant:

static void DrawMatrix(uint16_t Xpos, uint16_t Ypos,uint16_t Width, uint16_t High,const uint8_t* Matrix)
{
	uint16_t i,j,x,y;
	uint8_t R,G,B;
	uint8_t temp1,temp2;
	double Gray;
	
	for (y=0,j=Ypos;y<High;y++,j++)
	{
 		for (x=0,i=Xpos;x<Width;x++,i++)
		{
			switch(bmp_BitCount)
			{
				case 1:
				case 4:
				case 8:
					R = palette[Matrix[(y*Width+x)]].red;
					G = palette[Matrix[(y*Width+x)]].green;
					B = palette[Matrix[(y*Width+x)]].blue;
				break;
				
				case 16:
					temp1 = Matrix[(y*Width+x)*2];
					temp2 = Matrix[(y*Width+x)*2+1];
					R = (temp1 & 0x7c)<<1;
					G = (((temp1 & 0x03) << 3 ) | ((temp2&0xe0) >> 5))<<3;
					B = (temp2 & 0x1f)<<3;
				break;
				
				case 24:
					R = Matrix[(y*Width+x)*3];
					G = Matrix[(y*Width+x)*3+1];
					B = Matrix[(y*Width+x)*3+2];
				break;
				
				case 32:
					R = Matrix[(y*Width+x)*4];
					G = Matrix[(y*Width+x)*4+1];
					B = Matrix[(y*Width+x)*4+2];
				break;
				
				default:
				break;
			}
		
			Gray = (R*299 + G*587 + B*114 + 500) / 1000;
			EPD_DrawPixel(i, j, Gray);	
		}
	}
}